

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void __thiscall Search::BaseTask::Run(BaseTask *this)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  search_private *psVar4;
  stringstream *psVar5;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  psVar4 = this->sch->priv;
  bVar3 = psVar4->should_produce_string;
  if ((this->_final_run == false) &&
     (this->_with_output_string == (_func_void_search_ptr_stringstream_ptr *)0x0)) {
    psVar4->should_produce_string = false;
  }
  fVar1 = psVar4->test_loss;
  psVar4->learn_loss = psVar4->learn_loss * 0.5;
  fVar2 = psVar4->train_loss;
  if (psVar4->should_produce_string == true) {
    psVar5 = psVar4->pred_string;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
    std::__cxx11::stringbuf::str((string *)(psVar5 + 0x18));
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  psVar4->t = 0;
  psVar4->metaoverride = this;
  (*psVar4->task->run)(this->sch,this->ec);
  psVar4->metaoverride = (BaseTask *)0x0;
  psVar4->meta_t = psVar4->meta_t + psVar4->t;
  if ((this->_with_output_string != (_func_void_search_ptr_stringstream_ptr *)0x0 & bVar3) == 1) {
    (*this->_with_output_string)(this->sch,psVar4->pred_string);
  }
  psVar4->should_produce_string = bVar3;
  if (this->_final_run == false) {
    psVar4->test_loss = fVar1;
    psVar4->train_loss = fVar2;
  }
  return;
}

Assistant:

void BaseTask::Run()
{
  search_private& priv = *sch->priv;
  // make sure output is correct
  bool old_should_produce_string = priv.should_produce_string;
  if (!_final_run && !_with_output_string)
    priv.should_produce_string = false;
  // if this isn't a final run, it shouldn't count for loss
  float old_test_loss = priv.test_loss;
  // float old_learn_loss = priv.learn_loss;
  priv.learn_loss *= 0.5;
  float old_train_loss = priv.train_loss;

  if (priv.should_produce_string)
    priv.pred_string->str("");

  priv.t = 0;
  priv.metaoverride = this;
  priv.task->run(*sch, ec);
  priv.metaoverride = nullptr;
  priv.meta_t += priv.t;

  // restore
  if (_with_output_string && old_should_produce_string)
    _with_output_string(*sch, *priv.pred_string);

  priv.should_produce_string = old_should_produce_string;
  if (!_final_run)
  {
    priv.test_loss = old_test_loss;
    // priv.learn_loss = old_learn_loss;
    priv.train_loss = old_train_loss;
  }
}